

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

complex<double> __thiscall soul::Value::PackedData::getAsComplex64(PackedData *this)

{
  Primitive PVar1;
  undefined8 in_RAX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  complex<double> cVar3;
  undefined8 uVar2;
  
  PVar1 = (this->type->primitiveType).type;
  if (PVar1 == complex32) {
    getAs<std::complex<float>>(this);
    uVar2 = extraout_RDX;
  }
  else if (PVar1 == complex64) {
    cVar3 = getAs<std::complex<double>>(this);
    uVar2 = cVar3._M_value._8_8_;
  }
  else {
    getAsDouble(this);
    uVar2 = extraout_RDX_00;
  }
  cVar3._M_value._8_8_ = uVar2;
  cVar3._M_value._0_8_ = in_RAX;
  return (complex<double>)cVar3._M_value;
}

Assistant:

std::complex<double> getAsComplex64() const
    {
        if (type.isComplex64())  return getAs<std::complex<double>>();
        if (type.isComplex32())  return getAs<std::complex<float>>();

        return { getAsDouble(), 0.0 };
    }